

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O3

void run_collapse_task(parallel_task_1d *task,size_t thread_id)

{
  work_fn_t p_Var1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  work_item *pwVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  uVar8 = (task->range).begin;
  uVar3 = (task->range).end;
  if (uVar8 < uVar3) {
    do {
      uVar9 = (ulong)*(uint *)(task[1].work_item.work_fn + uVar8 * 0x20 + 0x18);
      if (uVar9 != 0) {
        *(ulong *)(task[1].range.begin + uVar8 * 8) = uVar9;
        uVar9 = uVar8;
        while( true ) {
          if (uVar9 == 0) {
            __assert_fail("node_index != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/accel/bvh.c"
                          ,0x17e,"size_t left_sibling(size_t)");
          }
          uVar4 = *(ulong *)(task[1].range.end + uVar9 * 8);
          if (uVar4 == 0xffffffffffffffff) break;
          LOCK();
          p_Var1 = task[2].work_item.work_fn + uVar4 * 4;
          iVar2 = *(int *)p_Var1;
          *(int *)p_Var1 = *(int *)p_Var1 + 1;
          UNLOCK();
          if (iVar2 == 0) break;
          uVar10 = (ulong)((uint)uVar9 & 1);
          uVar12 = (uVar9 + uVar10) - 1;
          p_Var1 = task[1].work_item.work_fn;
          if (uVar12 != *(uint *)(p_Var1 + uVar4 * 0x20 + 0x1c)) {
            __assert_fail("first_child == parent->first_child_or_primitive",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/accel/bvh.c"
                          ,0x197,"void run_collapse_task(struct parallel_task_1d *, size_t)");
          }
          sVar5 = task[1].range.begin;
          uVar6 = *(ulong *)(sVar5 + uVar12 * 8);
          if (uVar6 == 0) break;
          lVar11 = uVar10 + uVar9;
          uVar10 = *(ulong *)(sVar5 + lVar11 * 8);
          if (uVar10 == 0) break;
          pfVar14 = (float *)(p_Var1 + uVar4 * 0x20);
          lVar13 = uVar12 * 0x20;
          lVar15 = lVar11 * 0x20;
          fVar17 = pfVar14[1] - *pfVar14;
          if (fVar17 <= 0.0) {
            fVar17 = 0.0;
          }
          auVar20._0_4_ = pfVar14[3] - pfVar14[2];
          auVar20._4_4_ = pfVar14[5] - pfVar14[4];
          auVar20._8_8_ = 0;
          auVar20 = maxps(auVar20,ZEXT816(0));
          fVar19 = *(float *)(p_Var1 + lVar13 + 4) - *(float *)(p_Var1 + lVar13);
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          auVar18._0_4_ = *(float *)(p_Var1 + lVar13 + 0xc) - *(float *)(p_Var1 + lVar13 + 8);
          auVar18._4_4_ = *(float *)(p_Var1 + lVar13 + 0x14) - *(float *)(p_Var1 + lVar13 + 0x10);
          auVar18._8_8_ = 0;
          auVar18 = maxps(auVar18,ZEXT816(0));
          fVar16 = *(float *)(p_Var1 + lVar15 + 4) - *(float *)(p_Var1 + lVar15);
          if (fVar16 <= 0.0) {
            fVar16 = 0.0;
          }
          auVar21._0_4_ = *(float *)(p_Var1 + lVar15 + 0xc) - *(float *)(p_Var1 + lVar15 + 8);
          auVar21._4_4_ = *(float *)(p_Var1 + lVar15 + 0x14) - *(float *)(p_Var1 + lVar15 + 0x10);
          auVar21._8_8_ = 0;
          auVar21 = maxps(auVar21,ZEXT816(0));
          uVar9 = uVar4;
          if (((float)(uVar10 + uVar6) - *(float *)&task[2].work_item.next) *
              (auVar20._0_4_ * fVar17 + auVar20._4_4_ * fVar17 + auVar20._0_4_ * auVar20._4_4_) <
              (auVar21._0_4_ * fVar16 + auVar21._4_4_ * fVar16 + auVar21._0_4_ * auVar21._4_4_) *
              (float)uVar10 +
              (auVar18._0_4_ * fVar19 + auVar18._4_4_ * fVar19 + auVar18._0_4_ * auVar18._4_4_) *
              (float)uVar6) {
            *(ulong *)(sVar5 + uVar4 * 8) = uVar10 + uVar6;
            *(undefined8 *)(sVar5 + uVar12 * 8) = 0;
            *(undefined8 *)(sVar5 + lVar11 * 8) = 0;
            pwVar7 = task[1].work_item.next;
            *(undefined8 *)((long)pwVar7 + uVar12 * 8) = 0;
            (&pwVar7->work_fn)[lVar11] = (work_fn_t)0x0;
          }
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar3);
  }
  return;
}

Assistant:

static void run_collapse_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct collapse_task* collapse_task = (void*)task;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct bvh_node* node = &collapse_task->nodes[i];
        if (node->primitive_count == 0)
            continue;

        collapse_task->primitive_counts[i] = node->primitive_count;

        // Walk up the parents of this node towards the root
        size_t j = i;
        while (true) {
            size_t first_child = left_sibling(j);
            j = collapse_task->parents[j];

            // Terminate this path if the root has been reached or the two children have not yet been processed
            if (j == SIZE_MAX || atomic_fetch_add_explicit(&collapse_task->flags[j], 1, memory_order_relaxed) == 0)
                break;

            const struct bvh_node* parent = &collapse_task->nodes[j];
            assert(first_child == parent->first_child_or_primitive);

            size_t left_count  = collapse_task->primitive_counts[first_child + 0];
            size_t right_count = collapse_task->primitive_counts[first_child + 1];
            // Both children must be leaves in order to collapse this node
            if (left_count == 0 || right_count == 0)
                break;

            const struct bvh_node* left  = &collapse_task->nodes[first_child + 0];
            const struct bvh_node* right = &collapse_task->nodes[first_child + 1];
            size_t total_count = left_count + right_count;
            float collapse_cost =
                half_bbox_area(get_bvh_node_bbox(parent)) * (total_count - collapse_task->traversal_cost);
            float cost =
                half_bbox_area(get_bvh_node_bbox(left))  * left_count +
                half_bbox_area(get_bvh_node_bbox(right)) * right_count;
            if (collapse_cost < cost) {
                collapse_task->primitive_counts[j] = total_count;
                collapse_task->primitive_counts[first_child + 0] = 0;
                collapse_task->primitive_counts[first_child + 1] = 0;
                collapse_task->node_counts[first_child + 0] = 0;
                collapse_task->node_counts[first_child + 1] = 0;
            }
        }
    }
}